

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DETECT_GOLD(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  _Bool money;
  effect_handler_context_t_conflict *context_local;
  
  _Var1 = detect_stuff(context,tval_is_money);
  if (_Var1) {
    msg("You detect the presence of gold!");
  }
  else if ((context->aware & 1U) != 0) {
    msg("You detect no gold.");
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_GOLD(effect_handler_context_t *context)
{
	bool money = detect_stuff(context, tval_is_money);

	if (money) {
		msg("You detect the presence of gold!");
	} else if (context->aware) {
		msg("You detect no gold.");
	}

	context->ident = true;
	return true;
}